

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::java::IsReferenceType(JavaType type)

{
  LogMessage *other;
  LogFinisher local_55 [13];
  LogMessage local_48;
  JavaType local_10;
  bool local_9;
  JavaType type_local;
  
  switch(type) {
  case JAVATYPE_INT:
    local_9 = false;
    break;
  case JAVATYPE_LONG:
    local_9 = false;
    break;
  case JAVATYPE_FLOAT:
    local_9 = false;
    break;
  case JAVATYPE_DOUBLE:
    local_9 = false;
    break;
  case JAVATYPE_BOOLEAN:
    local_9 = false;
    break;
  case JAVATYPE_STRING:
    local_9 = true;
    break;
  case JAVATYPE_BYTES:
    local_9 = true;
    break;
  case JAVATYPE_ENUM:
    local_9 = true;
    break;
  case JAVATYPE_MESSAGE:
    local_9 = true;
    break;
  default:
    local_10 = type;
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x317);
    other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
    internal::LogFinisher::operator=(local_55,other);
    internal::LogMessage::~LogMessage(&local_48);
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool IsReferenceType(JavaType type) {
  switch (type) {
    case JAVATYPE_INT:
      return false;
    case JAVATYPE_LONG:
      return false;
    case JAVATYPE_FLOAT:
      return false;
    case JAVATYPE_DOUBLE:
      return false;
    case JAVATYPE_BOOLEAN:
      return false;
    case JAVATYPE_STRING:
      return true;
    case JAVATYPE_BYTES:
      return true;
    case JAVATYPE_ENUM:
      return true;
    case JAVATYPE_MESSAGE:
      return true;

      // No default because we want the compiler to complain if any new
      // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return false;
}